

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffgeom2pose-test.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char *benchmark;
  char *pcVar3;
  
  if (argc == 3) {
    pcVar3 = argv[1];
    iVar1 = strcmp(pcVar3,"double");
    if ((iVar1 == 0) && (iVar1 = strcmp(argv[2],"-benchmark"), iVar1 == 0)) {
LAB_001016b5:
      pcVar3 = "double";
    }
    else {
      iVar1 = strcmp(pcVar3,"float");
      if ((iVar1 != 0) || (iVar1 = strcmp(argv[2],"-benchmark"), iVar1 != 0)) goto LAB_00101695;
      pcVar3 = "float";
    }
    benchmark = "benchmark";
    goto LAB_001016d8;
  }
  if (argc == 2) {
    pcVar3 = argv[1];
    iVar1 = strcmp(pcVar3,"double");
    if (iVar1 == 0) goto LAB_00101630;
    iVar1 = strcmp(pcVar3,"float");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar3,"-benchmark");
      if (iVar1 != 0) goto LAB_00101695;
      goto LAB_001016b5;
    }
    pcVar3 = "float";
  }
  else {
    if (argc != 1) {
LAB_00101695:
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "usage: ./cmd [-benchmark]\n       ./cmd [double | float] [-benchmark]"
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      return 1;
    }
LAB_00101630:
    pcVar3 = "double";
  }
  benchmark = "no";
LAB_001016d8:
  test_run(pcVar3,benchmark);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
	switch (argc) {
	case 1:
		test_run("double");
		return 0;
	case 2:
		if      (strcmp(argv[1], "double")     == 0) test_run("double");
		else if (strcmp(argv[1], "float")      == 0) test_run("float");
		else if (strcmp(argv[1], "-benchmark") == 0) test_run("double", "benchmark");
		else break;
		return 0;
	case 3:
		if      ((strcmp(argv[1], "double") == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("double", "benchmark");
		else if ((strcmp(argv[1], "float")  == 0) && (strcmp(argv[2], "-benchmark") == 0))
			test_run("float", "benchmark");
		else break;
		return 0;
	}
	std::cout << "usage: ./cmd [-benchmark]\n"
				 "       ./cmd [double | float] [-benchmark]" << std::endl;
    return 1;
}